

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::VariablesQbIncrementPosition(ChNodeFEAxyzD *this,double step)

{
  double dVar1;
  double dVar2;
  ChVector<double> newspeed_D;
  ChVectorRef local_68;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_50 [56];
  
  ChNodeFEAxyz::VariablesQbIncrementPosition(&this->super_ChNodeFEAxyz,step);
  ChVariables::Get_qb(&local_68,*(ChVariables **)&(this->super_ChNodeFEAxyz).field_0xe8);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_50,&local_68,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&newspeed_D,local_50,(type *)0x0);
  dVar1 = *(double *)&this->field_0x100;
  dVar2 = *(double *)&this->field_0xf8;
  *(double *)&(this->super_ChNodeFEAxyz).field_0xf0 =
       step * newspeed_D.m_data[0] + *(double *)&(this->super_ChNodeFEAxyz).field_0xf0;
  *(double *)&this->field_0xf8 = step * newspeed_D.m_data[1] + dVar2;
  *(double *)&this->field_0x100 = step * newspeed_D.m_data[2] + dVar1;
  return;
}

Assistant:

void ChNodeFEAxyzD::VariablesQbIncrementPosition(double step) {
    ChNodeFEAxyz::VariablesQbIncrementPosition(step);

    ChVector<> newspeed_D(variables_D->Get_qb().segment(0, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    SetD(GetD() + newspeed_D * step);
}